

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenType BinaryenTypeCreate(BinaryenType *types,BinaryenIndex numTypes)

{
  TypeID TVar1;
  Type local_50;
  Type local_48;
  uint local_40;
  BinaryenIndex i;
  undefined1 local_30 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> typeVec;
  BinaryenIndex numTypes_local;
  BinaryenType *types_local;
  
  typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = numTypes;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_30);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_30,
             (ulong)typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_40 = 0;
      local_40 <
      typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_40 = local_40 + 1) {
    wasm::Type::Type(&local_48,types[local_40]);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_30,&local_48);
  }
  wasm::Type::Type(&local_50,(Tuple *)local_30);
  TVar1 = wasm::Type::getID(&local_50);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_30);
  return TVar1;
}

Assistant:

BinaryenType BinaryenTypeCreate(BinaryenType* types, BinaryenIndex numTypes) {
  std::vector<Type> typeVec;
  typeVec.reserve(numTypes);
  for (BinaryenIndex i = 0; i < numTypes; ++i) {
    typeVec.push_back(Type(types[i]));
  }
  return Type(typeVec).getID();
}